

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator iVar3;
  size_type sVar4;
  cmCPackComponent *pcVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  const_iterator cVar9;
  long *plVar10;
  cmValue cVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar13;
  char *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string *installType;
  _Alloc_hider _Var14;
  string_view value;
  string_view arg;
  string_view arg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCPackComponent *component;
  string macroPrefix;
  cmCPackComponent *child;
  string local_98;
  cmCPackComponent *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 local_50 [32];
  cmCPackComponentGroup *pcVar12;
  
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::find(&(this->Components)._M_t,name);
  local_78 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::operator[](&this->Components,name);
  if ((_Rb_tree_header *)cVar9._M_node == &(this->Components)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::SystemTools::UpperCase(&local_98,name);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x6ca2e8);
    local_70 = &local_60;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_60 = *plVar13;
      lStack_58 = plVar10[3];
    }
    else {
      local_60 = *plVar13;
      local_70 = (long *)*plVar10;
    }
    local_68 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    paVar2 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)local_78);
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_78->DisplayName);
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    bVar6 = IsOn(this,&local_98);
    local_78->field_0x48 = local_78->field_0x48 & 0xfd | bVar6 * '\x02';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    bVar6 = IsOn(this,&local_98);
    local_78->field_0x48 = local_78->field_0x48 & 0xfe | bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    bVar6 = IsOn(this,&local_98);
    local_78->field_0x48 = local_78->field_0x48 & 0xfb | bVar6 << 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    bVar6 = IsOn(this,&local_98);
    if (bVar6) {
      local_78->field_0x48 = local_78->field_0x48 | 8;
    }
    else {
      local_50._0_8_ = (cmCPackComponent *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CPACK_DOWNLOAD_ALL","");
      cVar11 = GetOption(this,(string *)local_50);
      if (cVar11.Value == (string *)0x0) {
        bVar7 = 0;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar11.Value)->_M_dataplus)._M_p;
        bVar6 = cmValue::IsOn((cmValue *)(cVar11.Value)->_M_string_length,value);
        bVar7 = bVar6 << 3;
      }
      local_78->field_0x48 = local_78->field_0x48 & 0xf7 | bVar7;
      if ((cmCPackComponent *)local_50._0_8_ != (cmCPackComponent *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    cVar11 = GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_78->ArchiveFile);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    cVar11 = GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_78->Plist);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    cVar11 = GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value == (string *)0x0) || ((cVar11.Value)->_M_string_length == 0)) {
      local_78->Group = (cmCPackComponentGroup *)0x0;
    }
    else {
      iVar8 = (*this->_vptr_cmCPackGenerator[0x1c])(this,projectName,cVar11.Value);
      pcVar12 = (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar8);
      local_78->Group = pcVar12;
      iVar3._M_current =
           (pcVar12->Components).
           super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pcVar12->Components).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
        _M_realloc_insert<cmCPackComponent*const&>
                  ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                   &pcVar12->Components,iVar3,&local_78);
      }
      else {
        *iVar3._M_current = local_78;
        pppcVar1 = &(pcVar12->Components).
                    super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    cVar11 = GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_78->Description);
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    cVar11 = GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
      arg._M_str = ((cVar11.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar11.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,arg,false);
      sVar4 = local_98._M_string_length;
      if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
        _Var14._M_p = local_98._M_dataplus._M_p;
        do {
          pcVar5 = local_78;
          iVar8 = (*this->_vptr_cmCPackGenerator[0x1a])(this,projectName,_Var14._M_p);
          local_50._0_8_ = CONCAT44(extraout_var_00,iVar8);
          std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
          emplace_back<cmCPackInstallationType*>
                    ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                     &pcVar5->InstallationTypes,(cmCPackInstallationType **)local_50);
          _Var14._M_p = _Var14._M_p + 0x20;
        } while (_Var14._M_p != (pointer)sVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_98);
    cVar11 = GetOption(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
      arg_00._M_str = ((cVar11.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar11.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,arg_00,false);
      if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
        _Var14._M_p = local_98._M_dataplus._M_p;
        do {
          iVar8 = (*this->_vptr_cmCPackGenerator[0x1b])(this,projectName,_Var14._M_p);
          local_50._0_8_ = CONCAT44(extraout_var_01,iVar8);
          iVar3._M_current =
               (local_78->Dependencies).
               super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_78->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       &local_78->Dependencies,iVar3,(cmCPackComponent **)local_50);
          }
          else {
            *iVar3._M_current = (cmCPackComponent *)local_50._0_8_;
            pppcVar1 = &(local_78->Dependencies).
                        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          iVar3._M_current = *(pointer *)(local_50._0_8_ + 0xe8);
          if (iVar3._M_current == *(pointer *)(local_50._0_8_ + 0xf0)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_50._0_8_ + 0xe0),iVar3,&local_78);
          }
          else {
            *iVar3._M_current = local_78;
            *(pointer *)(local_50._0_8_ + 0xe8) = *(pointer *)(local_50._0_8_ + 0xe8) + 1;
          }
          _Var14._M_p = _Var14._M_p + 0x20;
        } while (_Var14._M_p != (pointer)local_98._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
  }
  return local_78;
}

Assistant:

cmCPackComponent* cmCPackGenerator::GetComponent(
  const std::string& projectName, const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent* component = &this->Components[name];
  if (!hasComponent) {
    // Define the component
    std::string macroPrefix =
      "CPACK_COMPONENT_" + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    cmValue displayName = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (cmNonempty(displayName)) {
      component->DisplayName = *displayName;
    } else {
      component->DisplayName = component->Name;
    }
    component->IsHidden = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded = this->IsOn(macroPrefix + "_DOWNLOADED") ||
      cmIsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    cmValue archiveFile = this->GetOption(macroPrefix + "_ARCHIVE_FILE");
    if (cmNonempty(archiveFile)) {
      component->ArchiveFile = *archiveFile;
    }

    cmValue plist = this->GetOption(macroPrefix + "_PLIST");
    if (cmNonempty(plist)) {
      component->Plist = *plist;
    }

    cmValue groupName = this->GetOption(macroPrefix + "_GROUP");
    if (cmNonempty(groupName)) {
      component->Group = this->GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
    } else {
      component->Group = nullptr;
    }

    cmValue description = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (cmNonempty(description)) {
      component->Description = *description;
    }

    // Determine the installation types.
    cmValue installTypes = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (cmNonempty(installTypes)) {
      std::vector<std::string> installTypesVector =
        cmExpandedList(installTypes);
      for (std::string const& installType : installTypesVector) {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, installType));
      }
    }

    // Determine the component dependencies.
    cmValue depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (cmNonempty(depends)) {
      std::vector<std::string> dependsVector = cmExpandedList(depends);
      for (std::string const& depend : dependsVector) {
        cmCPackComponent* child = this->GetComponent(projectName, depend);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
      }
    }
  }
  return component;
}